

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_formats.c
# Opt level: O0

FMContext new_FMContext(void)

{
  FMContext __s;
  FMContext c;
  
  init_float_formats();
  __s = (FMContext)ffs_malloc((size_t)c);
  memset(__s,0,0x68);
  __s->ref_count = 1;
  __s->format_list_size = 0;
  __s->format_list = (FMFormat_conflict *)0x0;
  __s->reg_format_count = 0;
  __s->byte_reversal = 0;
  __s->native_float_format = fm_my_float_format;
  __s->native_column_major_arrays = 0;
  __s->native_pointer_size = 8;
  __s->errno_val = 0;
  __s->ignore_default_values = 0;
  __s->result = (char *)0x0;
  __s->self_server = 0;
  __s->self_server_fallback = 0;
  __s->server_fd = (void *)0xffffffffffffffff;
  __s->server_pid = 0;
  __s->server_byte_reversal = 0;
  __s->master_context = (FMContext)0x0;
  return __s;
}

Assistant:

extern
FMContext
new_FMContext()
{
    FMContext c;
    init_float_formats();
    c = (FMContext) malloc((size_t) sizeof(FMContextStruct));
    memset(c, 0, sizeof(FMContextStruct));
    c->ref_count = 1;
    c->format_list_size = 0;
    c->format_list = NULL;
    c->reg_format_count = 0;
    c->byte_reversal = 0;
    c->native_float_format = fm_my_float_format;
    c->native_column_major_arrays = 0;
    c->native_pointer_size = sizeof(char*);
    c->errno_val = 0;
    c->ignore_default_values = 0;
    c->result = NULL;
    
    c->self_server = 0;
    c->self_server_fallback = 0;
    c->server_fd = (char *) -1;
    c->server_pid = 0;
    c->server_byte_reversal = 0;
    c->master_context = NULL;

    return (c);
}